

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileselector.cpp
# Opt level: O0

int __thiscall
QFileSelectorPrivate::select
          (QFileSelectorPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  long lVar1;
  QChar c;
  bool bVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char16_t> QVar3;
  QFileSelector *q;
  QString ret;
  QString path;
  QString pathString;
  QFileInfo fi;
  QStringBuilder<QString_&,_char16_t> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  CaseSensitivity in_stack_fffffffffffffeb4;
  undefined6 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebe;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  QFileSelectorPrivate *this_00;
  QFileSelector *this_01;
  QFileSelectorPrivate *selectors;
  QString *in_stack_ffffffffffffff20;
  QString *in_stack_ffffffffffffff28;
  QChar local_72 [13];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  _func_int **local_20;
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> in_stack_ffffffffffffffe8;
  QChar indicator;
  
  indicator.ucs = (char16_t)((ulong)in_stack_ffffffffffffffe8.d >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  selectors = this;
  q_func((QFileSelectorPrivate *)CONCAT44(in_register_00000034,__nfds));
  local_20 = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QFileSelector *)&local_20;
  QFileInfo::QFileInfo
            ((QFileInfo *)this_00,
             (QString *)
             CONCAT17(in_stack_fffffffffffffecf,
                      CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2b2c3e);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::path((QFileInfo *)
                  CONCAT17(in_stack_fffffffffffffecf,
                           CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
  bVar2 = QString::isEmpty((QString *)0x2b2c7b);
  if (!bVar2) {
    QChar::QChar<char16_t,_true>(local_72,L'/');
    c.ucs._1_1_ = in_stack_fffffffffffffecf;
    c.ucs._0_1_ = in_stack_fffffffffffffece;
    in_stack_fffffffffffffecf =
         QString::endsWith((QString *)CONCAT26(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8),
                           c,in_stack_fffffffffffffeb4);
    if ((bool)in_stack_fffffffffffffecf) {
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (QString *)in_stack_fffffffffffffea8);
    }
    else {
      QVar3 = ::operator+((QString *)CONCAT26(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8),
                          (char16_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
      ;
      indicator.ucs = QVar3.a._6_2_;
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffea8);
    }
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (QString *)in_stack_fffffffffffffea8);
    QString::~QString((QString *)0x2b2d76);
  }
  QString::~QString((QString *)0x2b2dc0);
  QFileInfo::fileName((QFileInfo *)
                      CONCAT17(in_stack_fffffffffffffecf,
                               CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
  QFileSelector::allSelectors(this_01);
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff26,L'+');
  selectionHelper(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,(QStringList *)selectors,
                  indicator);
  QList<QString>::~QList((QList<QString> *)0x2b2e55);
  QString::~QString((QString *)0x2b2e62);
  bVar2 = QString::isEmpty((QString *)0x2b2e6f);
  if (bVar2) {
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (QString *)in_stack_fffffffffffffea8);
  }
  else {
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (QString *)in_stack_fffffffffffffea8);
  }
  QString::~QString((QString *)0x2b2ef5);
  QString::~QString((QString *)0x2b2f02);
  QFileInfo::~QFileInfo((QFileInfo *)0x2b2f0f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSelectorPrivate::select(const QString &filePath) const
{
    Q_Q(const QFileSelector);
    QFileInfo fi(filePath);

    QString pathString;
    if (auto path = fi.path(); !path.isEmpty())
        pathString = path.endsWith(u'/') ? path : path + u'/';
    QString ret = selectionHelper(pathString,
            fi.fileName(), q->allSelectors());

    if (!ret.isEmpty())
        return ret;
    return filePath;
}